

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall
Fad<long_double>::Fad<FadBinaryAdd<Fad<long_double>,Fad<long_double>>>
          (Fad<long_double> *this,
          FadExpr<FadBinaryAdd<Fad<long_double>,_Fad<long_double>_>_> *fadexpr)

{
  int csize;
  uint uVar1;
  Fad<long_double> *pFVar2;
  Fad<long_double> *pFVar3;
  int extraout_EDX;
  int iVar4;
  int extraout_EDX_00;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 Var9;
  unkbyte10 Var10;
  
  pFVar2 = (fadexpr->fadexpr_).left_;
  pFVar3 = (fadexpr->fadexpr_).right_;
  this->val_ = pFVar3->val_ + pFVar2->val_;
  iVar4 = (pFVar2->dx_).num_elts;
  csize = (pFVar3->dx_).num_elts;
  if (csize < iVar4) {
    csize = iVar4;
  }
  Var9 = in_ST5;
  Vector<long_double>::Vector(&this->dx_,csize);
  this->defaultVal = (longdouble)0;
  uVar1 = (((fadexpr->fadexpr_).left_)->dx_).num_elts;
  uVar7 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar7 < (int)uVar1) {
    uVar7 = uVar1;
  }
  if (uVar7 != 0) {
    uVar5 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar5;
    }
    iVar4 = extraout_EDX;
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      Var10 = Var9;
      FadBinaryAdd<Fad<long_double>,_Fad<long_double>_>::dx
                ((value_type *)fadexpr,
                 (FadBinaryAdd<Fad<long_double>,_Fad<long_double>_> *)(uVar6 & 0xffffffff),iVar4);
      *(unkbyte10 *)((long)(this->dx_).ptr_to_data + uVar5) = in_ST0;
      uVar5 = uVar5 + 0x10;
      iVar4 = extraout_EDX_00;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = Var9;
      Var9 = Var10;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }